

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDStats.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMDRTheta::processFrame(RNEMDRTheta *this,int istep)

{
  SelectionManager *this_00;
  double *pdVar1;
  undefined8 *puVar2;
  int *piVar3;
  double dVar4;
  double dVar5;
  pointer pOVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  pointer pVVar9;
  __uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
  _Var10;
  double dVar11;
  double dVar12;
  uint i_8;
  uint uVar13;
  StuntDouble *pSVar14;
  pair<int,_int> pVar15;
  uint i_2;
  pointer *ppOVar16;
  double (*padVar17) [3];
  allocator_type *paVar18;
  long lVar19;
  long lVar20;
  vector<double,_std::allocator<double>_> *pvVar21;
  SelectionSet *pSVar22;
  long lVar23;
  uint i_1;
  long lVar24;
  ulong uVar25;
  byte bVar26;
  double tmp_1;
  double tmp;
  Vector<double,_3U> result_3;
  int i;
  Mat3x3d I;
  Vector3<double> result;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  binL;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  binI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binCount;
  SquareMatrix3<double> result_1;
  pointer local_1b8 [3];
  int local_19c;
  SelectionSet local_198;
  double local_178;
  double local_158;
  vector<double,_std::allocator<double>_> local_148;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  local_100;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  local_e8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_d0;
  pointer local_b8 [10];
  pointer local_68 [4];
  Vector3d local_48;
  
  bVar26 = 0;
  ShellStatistics::processFrame(&this->super_ShellStatistics,istep);
  if ((this->super_ShellStatistics).super_SpatialStatistics.evaluator_.isDynamic_ == true) {
    SelectionEvaluator::evaluate
              (&local_198,&(this->super_ShellStatistics).super_SpatialStatistics.evaluator_);
    lVar24 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_ShellStatistics).super_SpatialStatistics.seleMan_.ss_.
                           bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar24),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_198.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar24));
      lVar24 = lVar24 + 0x28;
    } while (lVar24 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_198.bitsets_);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_d0,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::vector(&local_e8,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector(&local_100,
           (ulong)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_,
           (allocator_type *)&local_198);
  if ((this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_ != 0) {
    lVar24 = 0;
    uVar25 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&((local_d0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar24),(long)this->nAngleBins_);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      resize((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&((local_e8.
                          super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar24),(long)this->nAngleBins_
            );
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 ((long)&((local_100.
                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar24),
                 (long)this->nAngleBins_);
      uVar25 = uVar25 + 1;
      lVar24 = lVar24 + 0x18;
    } while (uVar25 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.
                      nBins_);
  }
  this_00 = &(this->super_ShellStatistics).super_SpatialStatistics.seleMan_;
  pSVar14 = SelectionManager::beginSelected(this_00,&local_19c);
  while (pSVar14 != (StuntDouble *)0x0) {
    lVar24 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
    local_48.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar24 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar24 + (long)pSVar14->localIndex_ * 0x18);
    local_48.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_48.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pVar15 = getBins(this,&local_48);
    uVar13 = pVar15.first;
    if ((((-1 < (int)uVar13) && (-1 < (long)pVar15)) &&
        ((int)uVar13 <
         (int)(this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_)) &&
       (uVar25 = (ulong)pVar15 >> 0x20, pVar15.second < this->nAngleBins_)) {
      DVar7 = pSVar14->storage_;
      pSVar8 = pSVar14->snapshotMan_->currentSnapshot_;
      lVar20 = (long)pSVar14->localIndex_;
      lVar24 = *(long *)((long)&(pSVar8->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + DVar7);
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(lVar24 + 0x10 + lVar20 * 0x18);
      puVar2 = (undefined8 *)(lVar24 + lVar20 * 0x18);
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar2;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)puVar2[1];
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar24 = 0;
      do {
        (&local_198.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar24] =
             (pointer)((double)(&local_148.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start)[lVar24] -
                      (this->super_ShellStatistics).coordinateOrigin_.super_Vector<double,_3U>.data_
                      [lVar24]);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      local_1b8[2] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b8[0] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_1b8[1] = local_198.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      lVar24 = *(long *)((long)&(pSVar8->atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + DVar7);
      dVar4 = *(double *)(lVar24 + lVar20 * 0x18);
      dVar5 = pSVar14->mass_;
      pdVar1 = (double *)(lVar24 + 8 + lVar20 * 0x18);
      dVar11 = *pdVar1;
      dVar12 = pdVar1[1];
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar12 * (double)local_198.bitsets_.
                                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                          (double)local_198.bitsets_.
                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage * dVar11);
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(dVar4 * (double)local_198.bitsets_.
                                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (double)local_198.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start * dVar12);
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((double)local_198.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start * dVar11 -
                    dVar4 * (double)local_198.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar24 = 0;
      do {
        (&local_198.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar24] =
             (pointer)((double)(&local_148.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start)[lVar24] * dVar5);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      local_68[2] = local_198.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68[0] = local_198.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_68[1] = local_198.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_b8[6] = (pointer)0x0;
      local_b8[7] = (pointer)0x0;
      local_b8[4] = (pointer)0x0;
      local_b8[5] = (pointer)0x0;
      local_b8[2] = (pointer)0x0;
      local_b8[3] = (pointer)0x0;
      local_b8[0] = (pointer)0x0;
      local_b8[1] = (pointer)0x0;
      local_b8[8] = (pointer)0x0;
      ppOVar16 = local_b8;
      lVar24 = 0;
      do {
        pOVar6 = local_1b8[lVar24];
        lVar20 = 0;
        do {
          ppOVar16[lVar20] = (pointer)((double)local_1b8[lVar20] * (double)pOVar6);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar24 = lVar24 + 1;
        ppOVar16 = ppOVar16 + 3;
      } while (lVar24 != 3);
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uStack_130 = 0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_108 = 0;
      ppOVar16 = local_b8;
      lVar24 = 0;
      pvVar21 = &local_148;
      do {
        lVar20 = 0;
        do {
          (&(pvVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start)[lVar20] = (pointer)((double)ppOVar16[lVar20] * dVar5);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar24 = lVar24 + 1;
        pvVar21 = pvVar21 + 1;
        ppOVar16 = ppOVar16 + 3;
      } while (lVar24 != 3);
      pvVar21 = &local_148;
      pSVar22 = &local_198;
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pSVar22->bitsets_).
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pvVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        pvVar21 = (vector<double,_std::allocator<double>_> *)
                  ((long)pvVar21 + ((ulong)bVar26 * -2 + 1) * 8);
        pSVar22 = (SelectionSet *)((long)pSVar22 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      dVar4 = 0.0;
      lVar24 = 0;
      do {
        dVar4 = dVar4 + (double)local_1b8[lVar24] * (double)local_1b8[lVar24];
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      dVar5 = dVar5 * dVar4;
      local_198.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((double)local_198.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start + dVar5);
      local_178 = local_178 + dVar5;
      local_158 = dVar5 + local_158;
      uVar13 = uVar13 & 0x7fffffff;
      padVar17 = (double (*) [3])
                 (local_e8.
                  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                  super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25);
      pSVar22 = &local_198;
      lVar24 = 0;
      do {
        lVar20 = 0;
        do {
          *(double *)
           ((long)(((SquareMatrix<double,_3> *)*padVar17)->super_RectMatrix<double,_3U,_3U>).data_ +
           lVar20 * 8) = (double)(&(pSVar22->bitsets_).
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[lVar20] +
                         *(double *)
                          ((long)(((SquareMatrix<double,_3> *)*padVar17)->
                                 super_RectMatrix<double,_3U,_3U>).data_ + lVar20 * 8);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar24 = lVar24 + 1;
        padVar17 = padVar17 + 1;
        pSVar22 = pSVar22 + 1;
      } while (lVar24 != 3);
      pVVar9 = local_100.
               super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = 0;
      do {
        pVVar9[uVar25].super_Vector<double,_3U>.data_[lVar24] =
             (double)local_68[lVar24] + pVVar9[uVar25].super_Vector<double,_3U>.data_[lVar24];
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      piVar3 = local_d0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar25;
      *piVar3 = *piVar3 + 1;
    }
    pSVar14 = SelectionManager::nextSelected(this_00,&local_19c);
  }
  if ((this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.nBins_ != 0) {
    uVar25 = 0;
    do {
      (**(code **)(*(long *)(this->r_).accumulator.
                            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_t.
                            super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                            ._M_t + 0x10))
                (SUB84(((double)(uVar25 & 0xffffffff) + 0.5) *
                       (this->super_ShellStatistics).binWidth_,0));
      std::vector<double,_std::allocator<double>_>::vector
                (&local_148,(long)this->nAngleBins_,(allocator_type *)&local_198);
      if (0 < this->nAngleBins_) {
        lVar24 = 0;
        lVar20 = 0;
        do {
          local_b8[0] = (pointer)0x0;
          local_b8[1] = (pointer)0x0;
          local_b8[2] = (pointer)0x0;
          if (0 < local_d0.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar20]) {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_198,
                       local_e8.
                       super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20);
            pVVar9 = local_100.
                     super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b8[0] = (pointer)0x0;
            local_1b8[1] = (pointer)0x0;
            local_1b8[2] = (pointer)0x0;
            lVar19 = 0;
            paVar18 = (allocator_type *)&local_198;
            do {
              pOVar6 = local_1b8[lVar19];
              lVar23 = 0;
              do {
                pOVar6 = (pointer)((double)pOVar6 +
                                  *(double *)(paVar18 + lVar23 * 8) *
                                  *(double *)
                                   ((long)(pVVar9->super_Vector<double,_3U>).data_ +
                                   lVar23 * 8 + lVar24));
                lVar23 = lVar23 + 1;
              } while (lVar23 != 3);
              local_1b8[lVar19] = pOVar6;
              lVar19 = lVar19 + 1;
              paVar18 = paVar18 + 0x18;
            } while (lVar19 != 3);
            local_b8[2] = local_1b8[2];
            local_b8[0] = local_1b8[0];
            local_b8[1] = local_1b8[1];
          }
          dVar4 = 0.0;
          lVar19 = 0;
          do {
            dVar4 = dVar4 + (double)local_b8[lVar19] *
                            (this->fluxVector_).super_Vector<double,_3U>.data_[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar20] = dVar4;
          lVar20 = lVar20 + 1;
          lVar24 = lVar24 + 0x18;
        } while (lVar20 < this->nAngleBins_);
      }
      _Var10._M_t.
      super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
      .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
           (this->angularVelocity_).accumulator.
           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_t.
           super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
           ._M_t;
      (**(code **)(*(long *)_Var10._M_t.
                            super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                            .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                            _M_head_impl + 0x18))
                (_Var10._M_t.
                 super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                 &local_148);
      if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (this->super_ShellStatistics).super_SpatialStatistics.super_StaticAnalyser.
                      nBins_);
  }
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::~vector(&local_100);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_d0);
  return;
}

Assistant:

void RNEMDRTheta::processFrame(int istep) {
    ShellStatistics::processFrame(istep);

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    StuntDouble* sd;
    int i;

    std::vector<std::vector<int>> binCount(nBins_);
    std::vector<std::vector<Mat3x3d>> binI(nBins_);
    std::vector<std::vector<Vector3d>> binL(nBins_);

    for (std::size_t i {}; i < nBins_; ++i) {
      binCount[i].resize(nAngleBins_);
      binI[i].resize(nAngleBins_);
      binL[i].resize(nAngleBins_);
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      std::pair<int, int> bins = getBins(sd->getPos());

      if (bins.first >= 0 && bins.first < int(nBins_)) {
        if (bins.second >= 0 && bins.second < nAngleBins_) {
          Vector3d rPos = sd->getPos() - coordinateOrigin_;
          Vector3d vel  = sd->getVel();
          RealType m    = sd->getMass();
          Vector3d L    = m * cross(rPos, vel);
          Mat3x3d I(0.0);
          I           = outProduct(rPos, rPos) * m;
          RealType r2 = rPos.lengthSquare();
          I(0, 0) += m * r2;
          I(1, 1) += m * r2;
          I(2, 2) += m * r2;

          binI[bins.first][bins.second] += I;
          binL[bins.first][bins.second] += L;
          binCount[bins.first][bins.second]++;
        }
      }
    }

    for (unsigned int i = 0; i < nBins_; i++) {
      RealType r = (((RealType)i + 0.5) * binWidth_);
      r_.accumulator[i]->add(r);

      std::vector<RealType> projections(nAngleBins_);

      for (int j = 0; j < nAngleBins_; j++) {
        Vector3d omega(0.0);

        if (binCount[i][j] > 0) { omega = binI[i][j].inverse() * binL[i][j]; }

        // RealType omegaProj = dot(omega, fluxVector_);
        projections[j] = dot(omega, fluxVector_);
      }

      angularVelocity_.accumulator[i]->add(projections);
    }
  }